

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_fail.cpp
# Opt level: O3

void __thiscall tst_qpromise_fail::baseClass(tst_qpromise_fail *this)

{
  QSharedData *pQVar1;
  PromiseResolver<int> PVar2;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> QVar3;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> QVar4;
  bool bVar5;
  PromiseDataBase<int,_void_(const_int_&)> *this_00;
  PromiseDataBase<int,_void_(const_int_&)> *this_01;
  PromiseData<int> *this_02;
  QPromiseReject<int> *in_R8;
  QSharedData *pQVar6;
  QByteArrayView QVar7;
  QStringView QVar8;
  QStringView QVar9;
  PromiseResolver<int> resolver_2;
  PromiseResolver<int> resolver_1;
  _Any_data local_160;
  QString *local_150;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_140;
  QPromise<int> local_138;
  function<void_(const_QtPromisePrivate::PromiseError_&)> local_128;
  QPromise<int> p;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_f0;
  _Any_data local_e8;
  code *local_d8;
  code *pcStack_d0;
  QSharedData *local_c8;
  QSharedData *local_c0;
  QString error;
  PromiseResolver<int> resolver;
  _Manager_type local_88;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _func_int **local_58;
  _Any_data local_50;
  code *local_40;
  
  std::out_of_range::out_of_range((out_of_range *)&local_160,"foo");
  QtPromise::QPromiseBase<int>::
  QPromiseBase<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_include____src_qtpromise_qpromise_inl:173:24),_0>
            (&p.super_QPromiseBase<int>,(out_of_range *)&local_160);
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001258e0;
  std::out_of_range::~out_of_range((out_of_range *)local_160._M_pod_data);
  error.d.d = (Data *)0x0;
  error.d.ptr = (char16_t *)0x0;
  error.d.size = 0;
  this_00 = (PromiseDataBase<int,_void_(const_int_&)> *)operator_new(0x68);
  this_00->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_00->super_QSharedData = 0;
  (this_00->m_error).m_data._M_exception_object = (void *)0x0;
  this_00[1]._vptr_PromiseDataBase = (_func_int **)0x0;
  (this_00->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->m_catchers).d.size = 0;
  (this_00->m_handlers).d.size = 0;
  (this_00->m_catchers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&this_00->m_lock = 0;
  *(undefined8 *)&this_00->m_settled = 0;
  *(undefined8 *)&this_00[1].super_QSharedData = 0;
  this_00->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_00125990;
  QReadWriteLock::QReadWriteLock(&this_00->m_lock,0);
  local_c0 = &this_00->super_QSharedData;
  this_00->m_settled = false;
  (this_00->m_handlers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (this_00->m_handlers).d.size = 0;
  (this_00->m_catchers).d.d = (Data *)0x0;
  (this_00->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->m_catchers).d.size = 0;
  (this_00->m_error).m_data._M_exception_object = (void *)0x0;
  local_58 = (_func_int **)&PTR__PromiseData_00125918;
  this_00->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseData_00125918;
  this_00[1]._vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_00[1].super_QSharedData = 0;
  LOCK();
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  LOCK();
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  local_128.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_001258e0;
  local_128.super__Function_base._M_functor._8_8_ = this_00;
  QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver,(QPromise<int> *)&local_128);
  local_128.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_00125880;
  if ((PromiseDataBase<int,_void_(const_int_&)> *)local_128.super__Function_base._M_functor._8_8_ !=
      (PromiseDataBase<int,_void_(const_int_&)> *)0x0) {
    LOCK();
    pQVar1 = (QSharedData *)(local_128.super__Function_base._M_functor._8_8_ + 8);
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseDataBase<int,_void_(const_int_&)> *)local_128.super__Function_base._M_functor._8_8_
        != (PromiseDataBase<int,_void_(const_int_&)> *)0x0)) {
      (**(code **)(*(long *)local_128.super__Function_base._M_functor._8_8_ + 8))();
    }
  }
  QVar3.d = p.super_QPromiseBase<int>.m_d.d;
  if (resolver.m_d.d == (Data *)0x0) {
    local_e8._M_unused._M_object = (Data *)0x0;
LAB_00105a01:
    resolver_1.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)(Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    local_e8._M_unused._M_object = (void *)resolver.m_d.d;
    if (resolver.m_d.d == (Data *)0x0) goto LAB_00105a01;
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    resolver_1.m_d.d = resolver.m_d.d;
  }
  QtPromisePrivate::PromiseHandler<int,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>
            ((function<void_(const_int_&)> *)&local_50,
             (PromiseHandler<int,decltype(nullptr),void> *)0x0,&local_e8,
             (QPromiseResolve<int> *)&resolver_1,in_R8);
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
            (&(QVar3.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_int_&)> *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  QVar3.d = p.super_QPromiseBase<int>.m_d.d;
  local_160._M_unused._M_object = local_e8._M_unused._M_object;
  if ((Data *)local_e8._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_e8._M_unused._0_8_ = *local_e8._M_unused._M_object + 1;
    UNLOCK();
  }
  local_160._8_8_ = resolver_1.m_d.d;
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
  }
  local_150 = &error;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_78._M_unused._M_object = operator_new(0x18);
  *(void **)local_78._M_unused._0_8_ = local_160._M_unused._M_object;
  if ((Data *)local_160._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_160._M_unused._0_8_ = *local_160._M_unused._M_object + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_78._M_unused._0_8_ + 8) = local_160._8_8_;
  if ((Data *)local_160._8_8_ == (Data *)0x0) {
    *(QString **)((long)local_78._M_unused._0_8_ + 0x10) = local_150;
    pcStack_60 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
                 ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
               ::_M_manager;
  }
  else {
    LOCK();
    *(int *)local_160._8_8_ = *(int *)local_160._8_8_ + 1;
    UNLOCK();
    *(QString **)((long)local_78._M_unused._0_8_ + 0x10) = local_150;
    pcStack_60 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
                 ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
               ::_M_manager;
    if ((Data *)local_160._8_8_ != (Data *)0x0) {
      LOCK();
      *(int *)local_160._8_8_ = *(int *)local_160._8_8_ + -1;
      UNLOCK();
      if (*(int *)local_160._8_8_ == 0) {
        operator_delete((void *)local_160._8_8_,0x10);
      }
    }
  }
  if ((Data *)local_160._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_160._M_unused._0_8_ = *local_160._M_unused._M_object + -1;
    UNLOCK();
    if (*local_160._M_unused._M_object == 0) {
      operator_delete(local_160._M_unused._M_object,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
            (&(QVar3.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver_1.m_d.d == 0) {
      operator_delete((void *)resolver_1.m_d.d,0x10);
    }
  }
  if ((Data *)local_e8._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_e8._M_unused._0_8_ = *local_e8._M_unused._M_object + -1;
    UNLOCK();
    if (*local_e8._M_unused._M_object == 0) {
      operator_delete(local_e8._M_unused._M_object,0x10);
    }
  }
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver.m_d.d == 0) {
      operator_delete((void *)resolver.m_d.d,0x10);
    }
  }
  bVar5 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    (&(p.super_QPromiseBase<int>.m_d.d)->
                      super_PromiseDataBase<int,_void_(const_int_&)>);
  if (!bVar5) {
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
              (&(p.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>);
  }
  this_01 = (PromiseDataBase<int,_void_(const_int_&)> *)operator_new(0x68);
  this_01->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_01->super_QSharedData = 0;
  (this_01->m_error).m_data._M_exception_object = (void *)0x0;
  this_01[1]._vptr_PromiseDataBase = (_func_int **)0x0;
  (this_01->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_01->m_catchers).d.size = 0;
  (this_01->m_handlers).d.size = 0;
  (this_01->m_catchers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&this_01->m_lock = 0;
  *(undefined8 *)&this_01->m_settled = 0;
  *(undefined8 *)&this_01[1].super_QSharedData = 0;
  this_01->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_00125990;
  QReadWriteLock::QReadWriteLock(&this_01->m_lock,0);
  this_01->m_settled = false;
  (this_01->m_handlers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (this_01->m_handlers).d.size = 0;
  (this_01->m_catchers).d.d = (Data *)0x0;
  (this_01->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_01->m_catchers).d.size = 0;
  (this_01->m_error).m_data._M_exception_object = (void *)0x0;
  this_01->_vptr_PromiseDataBase = local_58;
  this_01[1]._vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_01[1].super_QSharedData = 0;
  LOCK();
  (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  local_c8 = &this_01->super_QSharedData;
  LOCK();
  (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  local_128.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_001258e0;
  local_128.super__Function_base._M_functor._8_8_ = this_01;
  QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver_1,(QPromise<int> *)&local_128);
  local_128.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_00125880;
  if ((PromiseDataBase<int,_void_(const_int_&)> *)local_128.super__Function_base._M_functor._8_8_ !=
      (PromiseDataBase<int,_void_(const_int_&)> *)0x0) {
    LOCK();
    pQVar1 = (QSharedData *)(local_128.super__Function_base._M_functor._8_8_ + 8);
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseDataBase<int,_void_(const_int_&)> *)local_128.super__Function_base._M_functor._8_8_
        != (PromiseDataBase<int,_void_(const_int_&)> *)0x0)) {
      (**(code **)(*(long *)local_128.super__Function_base._M_functor._8_8_ + 8))();
    }
  }
  if (resolver_1.m_d.d == (Data *)0x0) {
    local_138.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)0x0;
LAB_00105d0f:
    resolver_2.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)(Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    local_138.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)resolver_1.m_d.d;
    if (resolver_1.m_d.d == (Data *)0x0) goto LAB_00105d0f;
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    resolver_2.m_d.d = resolver_1.m_d.d;
  }
  QtPromisePrivate::PromiseHandler<int,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>
            ((function<void_(const_int_&)> *)&resolver,
             (PromiseHandler<int,decltype(nullptr),void> *)0x0,&local_138,
             (QPromiseResolve<int> *)&resolver_2,in_R8);
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
            (this_00,(function<void_(const_int_&)> *)&resolver);
  if (local_88 != (_Manager_type)0x0) {
    (*local_88)((_Any_data *)&resolver,(_Any_data *)&resolver,__destroy_functor);
  }
  local_160._M_unused._M_object = local_138.super_QPromiseBase<int>._vptr_QPromiseBase;
  if ((Data *)local_138.super_QPromiseBase<int>._vptr_QPromiseBase != (Data *)0x0) {
    LOCK();
    (((QSharedData *)local_138.super_QPromiseBase<int>._vptr_QPromiseBase)->ref).
    super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i
         = (((QSharedData *)local_138.super_QPromiseBase<int>._vptr_QPromiseBase)->ref).
           super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_160._8_8_ = resolver_2.m_d.d;
  if (resolver_2.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
    UNLOCK();
  }
  local_150 = &error;
  local_e8._M_unused._M_object = (void *)0x0;
  local_e8._8_8_ = 0;
  local_d8 = (code *)0x0;
  pcStack_d0 = (code *)0x0;
  local_e8._M_unused._M_object = operator_new(0x18);
  *(void **)local_e8._M_unused._0_8_ = local_160._M_unused._M_object;
  if ((Data *)local_160._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_160._M_unused._0_8_ = *local_160._M_unused._M_object + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_e8._M_unused._0_8_ + 8) = local_160._8_8_;
  if ((Data *)local_160._8_8_ == (Data *)0x0) {
    *(QString **)((long)local_e8._M_unused._0_8_ + 0x10) = local_150;
    pcStack_d0 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
                 ::_M_invoke;
    local_d8 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
               ::_M_manager;
  }
  else {
    LOCK();
    *(int *)local_160._8_8_ = *(int *)local_160._8_8_ + 1;
    UNLOCK();
    *(QString **)((long)local_e8._M_unused._0_8_ + 0x10) = local_150;
    pcStack_d0 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
                 ::_M_invoke;
    local_d8 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
               ::_M_manager;
    if ((Data *)local_160._8_8_ != (Data *)0x0) {
      LOCK();
      *(int *)local_160._8_8_ = *(int *)local_160._8_8_ + -1;
      UNLOCK();
      if (*(int *)local_160._8_8_ == 0) {
        operator_delete((void *)local_160._8_8_,0x10);
      }
    }
  }
  if ((Data *)local_160._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_160._M_unused._0_8_ = *local_160._M_unused._M_object + -1;
    UNLOCK();
    if (*local_160._M_unused._M_object == 0) {
      operator_delete(local_160._M_unused._M_object,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
            (this_00,(function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_e8);
  if (local_d8 != (code *)0x0) {
    (*local_d8)(&local_e8,&local_e8,__destroy_functor);
  }
  if (resolver_2.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver_2.m_d.d == 0) {
      operator_delete((void *)resolver_2.m_d.d,0x10);
    }
  }
  if ((Data *)local_138.super_QPromiseBase<int>._vptr_QPromiseBase != (Data *)0x0) {
    LOCK();
    (((QSharedData *)local_138.super_QPromiseBase<int>._vptr_QPromiseBase)->ref).
    super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i
         = (((QSharedData *)local_138.super_QPromiseBase<int>._vptr_QPromiseBase)->ref).
           super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QSharedData *)local_138.super_QPromiseBase<int>._vptr_QPromiseBase)->ref).
        super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>.
        _M_i == 0) {
      operator_delete(local_138.super_QPromiseBase<int>._vptr_QPromiseBase,0x10);
    }
  }
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver_1.m_d.d == 0) {
      operator_delete((void *)resolver_1.m_d.d,0x10);
    }
  }
  bVar5 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending(this_00);
  if (!bVar5) {
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch(this_00);
  }
  this_02 = (PromiseData<int> *)operator_new(0x68);
  (this_02->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)&(this_02->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0;
  (this_02->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (this_02->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this_02->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_02->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (this_02->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (this_02->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (this_02->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (this_02->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&(this_02->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
  *(undefined8 *)&(this_02->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
  (this_02->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this_02->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseDataBase_00125990;
  QReadWriteLock::QReadWriteLock
            (&(this_02->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock,0);
  (this_02->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = false;
  (this_02->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (this_02->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (this_02->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (this_02->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (this_02->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_02->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (this_02->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (this_02->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase = local_58;
  (this_02->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this_02->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  LOCK();
  pQVar1 = &(this_02->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  pQVar6 = &(this_02->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  LOCK();
  pQVar1 = &(this_02->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_138.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001258e0;
  local_138.super_QPromiseBase<int>.m_d.d = this_02;
  QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver_2,&local_138);
  local_138.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00125880;
  if (local_138.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((local_138.super_QPromiseBase<int>.m_d.d)->
              super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (local_138.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
      (*((local_138.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  if (resolver_2.m_d.d == (Data *)0x0) {
    local_140.d = (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
    UNLOCK();
    local_140 = resolver_2.m_d.d;
    if (resolver_2.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
      UNLOCK();
      local_f0 = resolver_2.m_d.d;
      goto LAB_00105feb;
    }
  }
  local_f0.d = (Data *)0x0;
LAB_00105feb:
  QtPromisePrivate::PromiseHandler<int,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>
            ((function<void_(const_int_&)> *)&local_160,
             (PromiseHandler<int,decltype(nullptr),void> *)0x0,&local_140,
             (QPromiseResolve<int> *)&local_f0,in_R8);
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
            (this_01,(function<void_(const_int_&)> *)&local_160);
  if (local_150 != (QString *)0x0) {
    (*(code *)local_150)(&local_160,&local_160,3);
  }
  QVar4.d = local_f0.d;
  resolver_1.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)local_140.d;
  if (local_140.d != (Data *)0x0) {
    LOCK();
    ((local_140.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_140.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (local_f0.d != (Data *)0x0) {
    LOCK();
    ((local_f0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_f0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_128.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_128.super__Function_base._M_functor._8_8_ = 0;
  local_128.super__Function_base._M_manager = (_Manager_type)0x0;
  local_128._M_invoker = (_Invoker_type)0x0;
  local_128.super__Function_base._M_functor._M_unused._M_object = operator_new(0x18);
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
  local_128.super__Function_base._M_functor._M_unused._0_8_)->d = (Data *)resolver_1.m_d.d;
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
  }
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
  ((long)local_128.super__Function_base._M_functor._M_unused._0_8_ + 8))->d = QVar4.d;
  if (QVar4.d == (Data *)0x0) {
    ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
    ((long)local_128.super__Function_base._M_functor._M_unused._0_8_ + 0x10))->d = (Data *)&error;
    local_128._M_invoker =
         std::
         _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
         ::_M_invoke;
    local_128.super__Function_base._M_manager =
         std::
         _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
         ::_M_manager;
  }
  else {
    LOCK();
    ((QVar4.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar4.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
         ._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
    ((long)local_128.super__Function_base._M_functor._M_unused._0_8_ + 0x10))->d = (Data *)&error;
    local_128._M_invoker =
         std::
         _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
         ::_M_invoke;
    local_128.super__Function_base._M_manager =
         std::
         _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
         ::_M_manager;
    if (QVar4.d != (Data *)0x0) {
      LOCK();
      ((QVar4.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i =
           ((QVar4.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((QVar4.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
        operator_delete(QVar4.d,0x10);
      }
    }
  }
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver_1.m_d.d == 0) {
      operator_delete((void *)resolver_1.m_d.d,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher(this_01,&local_128);
  if (local_128.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_128.super__Function_base._M_manager)
              ((_Any_data *)&local_128,(_Any_data *)&local_128,__destroy_functor);
  }
  if (local_f0.d != (Data *)0x0) {
    LOCK();
    ((local_f0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          ((local_f0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type)
        ((local_f0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 0) {
      operator_delete(local_f0.d,0x10);
    }
  }
  if (local_140.d != (Data *)0x0) {
    LOCK();
    ((local_140.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_140.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_140.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_140.d,0x10);
    }
  }
  if (resolver_2.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver_2.m_d.d == 0) {
      operator_delete((void *)resolver_2.m_d.d,0x10);
    }
  }
  bVar5 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending(this_01);
  if (!bVar5) {
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch(this_01);
  }
  bVar5 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    ((PromiseDataBase<int,_void_(const_int_&)> *)this_02);
  while (bVar5 != false) {
    QCoreApplication::processEvents();
    QCoreApplication::sendPostedEvents((QObject *)0x0,0x34);
    bVar5 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                      ((PromiseDataBase<int,_void_(const_int_&)> *)this_02);
  }
  LOCK();
  (pQVar6->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar6->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  (pQVar6->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar6->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar6->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*(this_02->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])(this_02);
  }
  LOCK();
  (pQVar6->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar6->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar6->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*(this_02->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])(this_02);
  }
  LOCK();
  (local_c8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (local_c8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((local_c8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*this_01->_vptr_PromiseDataBase[1])(this_01);
  }
  LOCK();
  (local_c0->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (local_c0->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((local_c0->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*this_00->_vptr_PromiseDataBase[1])(this_00);
  }
  QVar7.m_data = (storage_type *)0x4;
  QVar7.m_size = (qsizetype)&resolver_1;
  QString::fromUtf8(QVar7);
  PVar2 = resolver_1;
  QVar8.m_data = error.d.ptr;
  QVar8.m_size = error.d.size;
  QVar9.m_data = (storage_type_conflict *)QVar4.d;
  QVar9.m_size = (qsizetype)&error;
  QTest::qCompare(QVar8,QVar9,"error","QString{\"foo1\"}",
                  "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_fail.cpp"
                  ,0x71);
  if (PVar2.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar2.m_d.d = *(int *)PVar2.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar2.m_d.d == 0) {
      QArrayData::deallocate((QArrayData *)PVar2.m_d.d,2,8);
    }
  }
  if (error.d.d != (Data *)0x0) {
    LOCK();
    ((error.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((error.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((error.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(error.d.d)->super_QArrayData,2,8);
    }
  }
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00125880;
  if (p.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((p.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
      (*((p.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  return;
}

Assistant:

void tst_qpromise_fail::baseClass()
{
    // http://en.cppreference.com/w/cpp/error/exception
    auto p = QtPromise::QPromise<int>::reject(std::out_of_range("foo"));

    QString error;
    p.fail([&](const std::runtime_error& e) {
         error += QString{e.what()} + "0";
         return -1;
     })
        .fail([&](const std::logic_error& e) {
            error += QString{e.what()} + "1";
            return -1;
        })
        .fail([&](const std::exception& e) {
            error += QString{e.what()} + "2";
            return -1;
        })
        .wait();

    QCOMPARE(error, QString{"foo1"});
}